

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O2

curltime Curl_pgrsTime(Curl_easy *data,timerid timer)

{
  undefined1 *puVar1;
  byte bVar2;
  undefined1 auVar3 [12];
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  time_t tVar8;
  timediff_t tVar9;
  long lVar10;
  int iVar11;
  timediff_t *ptVar12;
  curltime cVar13;
  curltime cVar14;
  curltime newer;
  curltime older;
  curltime older_00;
  
  cVar13 = Curl_now();
  tVar8 = cVar13.tv_sec;
  iVar11 = cVar13.tv_usec;
  auVar3 = cVar13._0_12_;
  switch(timer) {
  case TIMER_STARTOP:
    (data->progress).t_startop.tv_sec = tVar8;
    (data->progress).t_startop.tv_usec = iVar11;
    goto switchD_001345fa_caseD_8;
  case TIMER_STARTSINGLE:
    (data->progress).t_startsingle.tv_sec = tVar8;
    (data->progress).t_startsingle.tv_usec = iVar11;
    puVar1 = &(data->progress).field_0x184;
    *puVar1 = *puVar1 & 0xfd;
    goto switchD_001345fa_caseD_8;
  case TIMER_NAMELOOKUP:
    ptVar12 = &(data->progress).t_nslookup;
    break;
  case TIMER_CONNECT:
    ptVar12 = &(data->progress).t_connect;
    break;
  case TIMER_APPCONNECT:
    ptVar12 = &(data->progress).t_appconnect;
    break;
  case TIMER_PRETRANSFER:
    ptVar12 = &(data->progress).t_pretransfer;
    break;
  case TIMER_STARTTRANSFER:
    bVar2 = (data->progress).field_0x184;
    if ((bVar2 & 2) != 0) goto switchD_001345fa_caseD_8;
    ptVar12 = &(data->progress).t_starttransfer;
    (data->progress).field_0x184 = bVar2 | 2;
    break;
  default:
    goto switchD_001345fa_caseD_8;
  case TIMER_STARTACCEPT:
    (data->progress).t_acceptdata.tv_sec = tVar8;
    (data->progress).t_acceptdata.tv_usec = iVar11;
    goto switchD_001345fa_caseD_8;
  case TIMER_REDIRECT:
    uVar6 = (data->progress).start.tv_sec;
    uVar7 = (data->progress).start.tv_usec;
    older_00.tv_usec = uVar7;
    older_00.tv_sec = uVar6;
    cVar13._12_4_ = 0;
    cVar13.tv_sec = auVar3._0_8_;
    cVar13.tv_usec = auVar3._8_4_;
    older_00._12_4_ = 0;
    tVar9 = Curl_timediff_us(cVar13,older_00);
    (data->progress).t_redirect = tVar9;
    goto switchD_001345fa_caseD_8;
  }
  uVar4 = (data->progress).t_startsingle.tv_sec;
  uVar5 = (data->progress).t_startsingle.tv_usec;
  older.tv_usec = uVar5;
  older.tv_sec = uVar4;
  newer._12_4_ = 0;
  newer.tv_sec = auVar3._0_8_;
  newer.tv_usec = auVar3._8_4_;
  older._12_4_ = 0;
  tVar9 = Curl_timediff_us(newer,older);
  lVar10 = 1;
  if (1 < tVar9) {
    lVar10 = tVar9;
  }
  *ptVar12 = *ptVar12 + lVar10;
switchD_001345fa_caseD_8:
  cVar14._12_4_ = 0;
  cVar14.tv_sec = auVar3._0_8_;
  cVar14.tv_usec = auVar3._8_4_;
  return cVar14;
}

Assistant:

struct curltime Curl_pgrsTime(struct Curl_easy *data, timerid timer)
{
  struct curltime now = Curl_now();
  timediff_t *delta = NULL;

  switch(timer) {
  default:
  case TIMER_NONE:
    /* mistake filter */
    break;
  case TIMER_STARTOP:
    /* This is set at the start of a transfer */
    data->progress.t_startop = now;
    break;
  case TIMER_STARTSINGLE:
    /* This is set at the start of each single fetch */
    data->progress.t_startsingle = now;
    data->progress.is_t_startransfer_set = false;
    break;
  case TIMER_STARTACCEPT:
    data->progress.t_acceptdata = now;
    break;
  case TIMER_NAMELOOKUP:
    delta = &data->progress.t_nslookup;
    break;
  case TIMER_CONNECT:
    delta = &data->progress.t_connect;
    break;
  case TIMER_APPCONNECT:
    delta = &data->progress.t_appconnect;
    break;
  case TIMER_PRETRANSFER:
    delta = &data->progress.t_pretransfer;
    break;
  case TIMER_STARTTRANSFER:
    delta = &data->progress.t_starttransfer;
    /* prevent updating t_starttransfer unless:
     *   1) this is the first time we're setting t_starttransfer
     *   2) a redirect has occurred since the last time t_starttransfer was set
     * This prevents repeated invocations of the function from incorrectly
     * changing the t_starttransfer time.
     */
    if(data->progress.is_t_startransfer_set) {
      return now;
    }
    else {
      data->progress.is_t_startransfer_set = true;
      break;
    }
  case TIMER_POSTRANSFER:
    /* this is the normal end-of-transfer thing */
    break;
  case TIMER_REDIRECT:
    data->progress.t_redirect = Curl_timediff_us(now, data->progress.start);
    break;
  }
  if(delta) {
    timediff_t us = Curl_timediff_us(now, data->progress.t_startsingle);
    if(us < 1)
      us = 1; /* make sure at least one microsecond passed */
    *delta += us;
  }
  return now;
}